

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

void reset_visuals(_Bool load_prefs)

{
  feature *pfVar1;
  monster_race *pmVar2;
  object_kind *poVar3;
  trap_kind_conflict *ptVar4;
  flavor *pfVar5;
  graphics_mode *pgVar6;
  ulong uVar7;
  long lVar8;
  char buf [2014];
  char acStack_7e8 [2016];
  
  if (z_info->f_max != 0) {
    uVar7 = 0;
    do {
      pfVar1 = f_info;
      lVar8 = 0;
      do {
        *(uint8_t *)(*(long *)((long)feat_x_attr + lVar8) + uVar7) = pfVar1[uVar7].d_attr;
        *(wchar_t *)(*(long *)((long)feat_x_char + lVar8) + uVar7 * 4) = pfVar1[uVar7].d_char;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 < z_info->f_max);
  }
  if (z_info->k_max != 0) {
    lVar8 = 0x8b;
    uVar7 = 0;
    do {
      poVar3 = k_info;
      kind_x_attr[uVar7] = *(uint8_t *)((long)k_info + lVar8 * 4 + -4);
      kind_x_char[uVar7] = *(wchar_t *)(poVar3->flags + lVar8 * 4 + -0x80);
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0xb0;
    } while (uVar7 < z_info->k_max);
  }
  if (z_info->r_max != 0) {
    lVar8 = 0x23;
    uVar7 = 0;
    do {
      pmVar2 = r_info;
      monster_x_attr[uVar7] = r_info->flags[lVar8 * 4 + -0x60];
      monster_x_char[uVar7] = *(wchar_t *)(pmVar2->flags + lVar8 * 4 + -0x5c);
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x34;
    } while (uVar7 < z_info->r_max);
  }
  pfVar5 = flavors;
  if (z_info->trap_max != 0) {
    uVar7 = 0;
    do {
      ptVar4 = trap_info;
      lVar8 = 0;
      do {
        *(uint8_t *)(*(long *)((long)trap_x_attr + lVar8) + uVar7) = ptVar4[uVar7].d_attr;
        *(wchar_t *)(*(long *)((long)trap_x_char + lVar8) + uVar7 * 4) = ptVar4[uVar7].d_char;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      uVar7 = uVar7 + 1;
      pfVar5 = flavors;
    } while (uVar7 < z_info->trap_max);
  }
  for (; pfVar5 != (flavor *)0x0; pfVar5 = pfVar5->next) {
    flavor_x_attr[pfVar5->fidx] = pfVar5->d_attr;
    flavor_x_char[pfVar5->fidx] = pfVar5->d_char;
  }
  if (load_prefs) {
    if (use_graphics == L'\0') {
      process_pref_file("font.prf",false,false);
      return;
    }
    pgVar6 = get_graphics_mode((uint8_t)use_graphics);
    if (pgVar6 == (graphics_mode *)0x0) {
      __assert_fail("mode",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                    ,0x574,"void reset_visuals(_Bool)");
    }
    path_build(acStack_7e8,0x7de,pgVar6->path,pgVar6->pref);
    process_pref_file_named(acStack_7e8,false,false);
  }
  return;
}

Assistant:

void reset_visuals(bool load_prefs)
{
	int i, j;
	struct flavor *f;

	/* Extract default attr/char code for features */
	for (i = 0; i < z_info->f_max; i++) {
		struct feature *feat = &f_info[i];

		/* Assume we will use the underlying values */
		for (j = 0; j < LIGHTING_MAX; j++) {
			feat_x_attr[j][i] = feat->d_attr;
			feat_x_char[j][i] = feat->d_char;
		}
	}

	/* Extract default attr/char code for objects */
	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Default attr/char */
		kind_x_attr[i] = kind->d_attr;
		kind_x_char[i] = kind->d_char;
	}

	/* Extract default attr/char code for monsters */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		/* Default attr/char */
		monster_x_attr[i] = race->d_attr;
		monster_x_char[i] = race->d_char;
	}

	/* Extract default attr/char code for traps */
	for (i = 0; i < z_info->trap_max; i++) {
		struct trap_kind *trap = &trap_info[i];

		/* Default attr/char */
		for (j = 0; j < LIGHTING_MAX; j++) {
			trap_x_attr[j][i] = trap->d_attr;
			trap_x_char[j][i] = trap->d_char;
		}
	}

	/* Extract default attr/char code for flavors */
	for (f = flavors; f; f = f->next) {
		flavor_x_attr[f->fidx] = f->d_attr;
		flavor_x_char[f->fidx] = f->d_char;
	}

	if (!load_prefs)
		return;

	/* Graphic symbols */
	if (use_graphics) {
		/* if we have a graphics mode, see if the mode has a pref file name */
		graphics_mode *mode = get_graphics_mode(use_graphics);
		char buf[2014];

		assert(mode);

		/* Build path to the pref file */
		path_build(buf, sizeof buf, mode->path, mode->pref);

		process_pref_file_named(buf, false, false);
	} else {
		/* Normal symbols */
		process_pref_file("font.prf", false, false);
	}
}